

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int whereLoopAddBtree(WhereLoopBuilder *pBuilder,Bitmask mPrereq)

{
  short *psVar1;
  byte *pbVar2;
  byte bVar3;
  byte bVar4;
  ushort uVar5;
  WhereLoop *pLoop;
  SrcList *pSVar6;
  Index *pIVar7;
  bool bVar8;
  u8 uVar9;
  u8 uVar10;
  LogEst LVar11;
  short sVar12;
  LogEst LVar13;
  int iVar14;
  u32 uVar15;
  int iVar16;
  uint uVar17;
  Expr *pA;
  Bitmask BVar18;
  short sVar19;
  WhereTerm *pWVar20;
  int iVar21;
  long lVar22;
  short sVar23;
  Table *pTVar24;
  Index *pIdx;
  WhereTerm *pWVar25;
  ulong uVar26;
  long lVar27;
  ExprList_item *pEVar28;
  bool bVar29;
  i16 aiColumnPk;
  Table *local_e8;
  ExprList *local_e0;
  WhereInfo *local_d8;
  ulong local_d0;
  WhereLoopBuilder *local_c8;
  WhereClause *local_c0;
  Bitmask local_b8;
  ExprList_item *local_b0;
  long local_a8;
  LogEst aiRowEstPk [2];
  Index sPk;
  
  aiColumnPk = -1;
  pLoop = pBuilder->pNew;
  local_d8 = pBuilder->pWInfo;
  pSVar6 = local_d8->pTabList;
  bVar3 = pLoop->iTab;
  local_e8 = pSVar6->a[bVar3].pTab;
  pIVar7 = pSVar6->a[bVar3].pIBIndex;
  pIdx = pIVar7;
  if (pIVar7 == (Index *)0x0) {
    if ((local_e8->tabFlags & 0x20) == 0) {
      pIdx = &sPk;
      sPk.aColExpr = (ExprList *)0x0;
      sPk.zName = (char *)0x0;
      sPk.azColl = (char **)0x0;
      sPk.pPartIdxWhere = (Expr *)0x0;
      sPk.pSchema = (Schema *)0x0;
      sPk.aSortOrder = (u8 *)0x0;
      sPk.zColAff = (char *)0x0;
      sPk.pNext = (Index *)0x0;
      sPk.aiColumn = &aiColumnPk;
      sPk.aiRowLogEst = aiRowEstPk;
      sPk.nColumn = 1;
      sPk.onError = '\x05';
      sPk._99_5_ = 0;
      sPk._88_6_ = (uint6)(ushort)local_e8->szTabRow << 0x20;
      sPk.nKeyCol = 1;
      aiRowEstPk[0] = local_e8->nRowLogEst;
      aiRowEstPk[1] = 0;
      sPk.pTable = local_e8;
      if ((pSVar6->a[bVar3].fg.field_0x1 & 1) == 0) {
        sPk.pNext = local_e8->pIndex;
      }
    }
    else {
      pIdx = local_e8->pIndex;
    }
  }
  local_c0 = pBuilder->pWC;
  LVar13 = local_e8->nRowLogEst;
  local_b8 = mPrereq;
  LVar11 = estLog(LVar13);
  iVar21 = 0;
  if ((((pBuilder->pOrSet == (WhereOrSet *)0x0) && (iVar21 = 0, (local_d8->wctrlFlags & 0x20) == 0))
      && (iVar21 = 0, (local_d8->pParse->db->flags & 0x8000) != 0)) &&
     (iVar21 = 0, pIVar7 == (Index *)0x0)) {
    bVar4 = pSVar6->a[bVar3].fg.field_0x1;
    iVar21 = 0;
    if ((((bVar4 & 1) == 0) && (iVar21 = 0, (bVar4 & 0x28) == 0)) &&
       (iVar21 = 0, (local_e8->tabFlags & 0x20) == 0)) {
      pWVar20 = local_c0->a;
      pWVar25 = pWVar20 + local_c0->nTerm;
      sVar23 = LVar11 + LVar13 + 4;
      sVar19 = LVar11 + LVar13 + 0x1c;
      iVar21 = 0;
      local_d0 = CONCAT44(local_d0._4_4_,(int)LVar11);
      for (; (iVar21 == 0 && (pWVar20 < pWVar25)); pWVar20 = pWVar20 + 1) {
        iVar21 = 0;
        if ((pWVar20->prereqRight & pLoop->maskSelf) == 0) {
          iVar21 = 0;
          iVar14 = termCanDriveIndex(pWVar20,pSVar6->a + bVar3,0);
          if (iVar14 != 0) {
            (pLoop->u).btree.nEq = 1;
            (pLoop->u).btree.pIndex = (Index *)0x0;
            pLoop->nLTerm = 1;
            pLoop->nSkip = 0;
            *pLoop->aLTerm = pWVar20;
            pLoop->rSetup = sVar23;
            sVar12 = sVar23;
            if ((local_e8->pSelect == (Select *)0x0) && ((local_e8->tabFlags & 2) == 0)) {
              pLoop->rSetup = sVar19;
              sVar12 = sVar19;
            }
            if (sVar12 < 0) {
              pLoop->rSetup = 0;
            }
            pLoop->nOut = 0x2b;
            LVar13 = sqlite3LogEstAdd((LogEst)local_d0,0x2b);
            pLoop->rRun = LVar13;
            pLoop->wsFlags = 0x4000;
            pLoop->prereq = pWVar20->prereqRight | local_b8;
            iVar21 = whereLoopInsert(pBuilder,pLoop);
          }
        }
      }
    }
  }
  uVar9 = '\x01';
  local_c8 = pBuilder;
LAB_0016602d:
  if ((iVar21 != 0) || (pIdx == (Index *)0x0)) {
    return iVar21;
  }
  if ((pIdx->pPartIdxWhere == (Expr *)0x0) ||
     (iVar21 = whereUsablePartialIndex(pSVar6->a[bVar3].iCursor,local_c0,pIdx->pPartIdxWhere),
     iVar21 != 0)) {
    uVar5 = *pIdx->aiRowLogEst;
    local_d0 = (ulong)uVar5;
    (pLoop->u).vtab.idxNum = 0;
    (pLoop->u).btree.nTop = 0;
    pLoop->nLTerm = 0;
    pLoop->nSkip = 0;
    pLoop->iSortIdx = '\0';
    pLoop->rSetup = 0;
    pLoop->prereq = local_b8;
    pLoop->nOut = uVar5;
    (pLoop->u).btree.pIndex = pIdx;
    bVar8 = true;
    if (((pIdx->field_0x63 & 4) == 0) &&
       (local_e0 = pBuilder->pWInfo->pOrderBy, local_e0 != (ExprList *)0x0)) {
      iVar21 = pSVar6->a[bVar3].iCursor;
      local_b0 = local_e0->a;
      lVar27 = 0;
      while (bVar8 = local_e0->nExpr <= lVar27, lVar27 < local_e0->nExpr) {
        local_a8 = lVar27;
        pA = sqlite3ExprSkipCollate(local_b0[lVar27].pExpr);
        if ((pA->op == 0x98) && (pA->iTable == iVar21)) {
          if (pA->iColumn < 0) break;
          uVar26 = 0;
          while (pIdx->nKeyCol != uVar26) {
            psVar1 = pIdx->aiColumn + uVar26;
            uVar26 = uVar26 + 1;
            if (pA->iColumn == *psVar1) goto LAB_001661a2;
          }
        }
        else if (pIdx->aColExpr != (ExprList *)0x0) {
          pEVar28 = pIdx->aColExpr->a;
          for (uVar26 = 0; uVar26 < pIdx->nKeyCol; uVar26 = uVar26 + 1) {
            if ((pIdx->aiColumn[uVar26] == -2) &&
               (iVar14 = sqlite3ExprCompare((Parse *)0x0,pA,pEVar28->pExpr,iVar21), iVar14 == 0))
            goto LAB_001661a2;
            pEVar28 = pEVar28 + 1;
          }
        }
        pBuilder = local_c8;
        lVar27 = local_a8 + 1;
      }
    }
    goto LAB_001661b1;
  }
  iVar21 = 0;
  goto LAB_001663a9;
LAB_001661a2:
  bVar8 = false;
  pBuilder = local_c8;
LAB_001661b1:
  LVar13 = (LogEst)local_d0;
  if (pIdx->tnum < 1) {
    uVar10 = uVar9;
    if (bVar8) {
      uVar10 = '\0';
    }
    pLoop->wsFlags = 0x100;
    pLoop->iSortIdx = uVar10;
    pLoop->rRun = LVar13 + 0x10;
    whereLoopOutputAdjust(local_c0,pLoop,LVar13);
    iVar21 = whereLoopInsert(pBuilder,pLoop);
    pLoop->nOut = LVar13;
    pTVar24 = local_e8;
  }
  else {
    if ((pIdx->field_0x63 & 0x20) == 0) {
      local_e0 = (ExprList *)pSVar6->a[bVar3].colUsed;
      BVar18 = columnsInIndex(pIdx);
      bVar29 = ((ulong)local_e0 & ~BVar18) == 0;
      uVar15 = (bVar29 | 8) << 6;
    }
    else {
      bVar29 = true;
      uVar15 = 0x240;
    }
    pLoop->wsFlags = uVar15;
    uVar10 = uVar9;
    if (bVar8) {
      uVar10 = '\0';
      if ((((local_e8->tabFlags & 0x20) == 0) && (pIdx->pPartIdxWhere == (Expr *)0x0)) &&
         ((pTVar24 = local_e8, !bVar29 ||
          (((((pIdx->field_0x63 & 4) != 0 || (local_e8->szTabRow <= pIdx->szIdxRow)) ||
            ((local_d8->wctrlFlags & 4) != 0)) ||
           ((sqlite3Config.bUseCis == 0 ||
            (uVar10 = '\0', (local_d8->pParse->db->dbOptFlags & 0x40) != 0))))))))
      goto LAB_0016637e;
    }
    pLoop->iSortIdx = uVar10;
    pLoop->rRun = (short)((pIdx->szIdxRow * 0xf) / (int)local_e8->szTabRow) + (short)local_d0 + 1;
    if (!bVar29) {
      local_e0 = (ExprList *)CONCAT44(local_e0._4_4_,(int)LVar13);
      iVar14 = (int)local_d0 + 0x10;
      iVar21 = pSVar6->a[bVar3].iCursor;
      lVar27 = 0x14;
      for (lVar22 = 0; lVar22 < (local_d8->sWC).nTerm; lVar22 = lVar22 + 1) {
        pWVar20 = (local_d8->sWC).a;
        iVar16 = sqlite3ExprCoveredByIndex(*(Expr **)((long)pWVar20 + lVar27 + -0x14),iVar21,pIdx);
        if (iVar16 == 0) break;
        uVar5 = *(ushort *)((long)pWVar20 + lVar27 + -4);
        uVar17 = (uint)uVar5;
        if (0 < (short)uVar5) {
          uVar17 = -(uint)((*(byte *)((long)&pWVar20->pExpr + lVar27) & 0x82) == 0) | 0xffec;
        }
        iVar14 = uVar17 + iVar14;
        lVar27 = lVar27 + 0x40;
      }
      LVar13 = sqlite3LogEstAdd(pLoop->rRun,(LogEst)iVar14);
      pLoop->rRun = LVar13;
      LVar13 = (LogEst)local_e0;
      pBuilder = local_c8;
    }
    uVar26 = local_d0;
    pTVar24 = local_e8;
    whereLoopOutputAdjust(local_c0,pLoop,LVar13);
    iVar21 = whereLoopInsert(pBuilder,pLoop);
    pLoop->nOut = (LogEst)uVar26;
  }
  if (iVar21 != 0) {
    return iVar21;
  }
LAB_0016637e:
  pBuilder->bldFlags = 0;
  iVar21 = whereLoopAddBtreeIndex(pBuilder,pSVar6->a + bVar3,pIdx,0);
  if (pBuilder->bldFlags == 1) {
    pbVar2 = (byte *)((long)&pTVar24->tabFlags + 1);
    *pbVar2 = *pbVar2 | 1;
  }
  if (pSVar6->a[bVar3].pIBIndex != (Index *)0x0) {
    return iVar21;
  }
LAB_001663a9:
  pIdx = pIdx->pNext;
  uVar9 = uVar9 + '\x01';
  goto LAB_0016602d;
}

Assistant:

static int whereLoopAddBtree(
  WhereLoopBuilder *pBuilder, /* WHERE clause information */
  Bitmask mPrereq             /* Extra prerequesites for using this table */
){
  WhereInfo *pWInfo;          /* WHERE analysis context */
  Index *pProbe;              /* An index we are evaluating */
  Index sPk;                  /* A fake index object for the primary key */
  LogEst aiRowEstPk[2];       /* The aiRowLogEst[] value for the sPk index */
  i16 aiColumnPk = -1;        /* The aColumn[] value for the sPk index */
  SrcList *pTabList;          /* The FROM clause */
  struct SrcList_item *pSrc;  /* The FROM clause btree term to add */
  WhereLoop *pNew;            /* Template WhereLoop object */
  int rc = SQLITE_OK;         /* Return code */
  int iSortIdx = 1;           /* Index number */
  int b;                      /* A boolean value */
  LogEst rSize;               /* number of rows in the table */
  LogEst rLogSize;            /* Logarithm of the number of rows in the table */
  WhereClause *pWC;           /* The parsed WHERE clause */
  Table *pTab;                /* Table being queried */
  
  pNew = pBuilder->pNew;
  pWInfo = pBuilder->pWInfo;
  pTabList = pWInfo->pTabList;
  pSrc = pTabList->a + pNew->iTab;
  pTab = pSrc->pTab;
  pWC = pBuilder->pWC;
  assert( !IsVirtual(pSrc->pTab) );

  if( pSrc->pIBIndex ){
    /* An INDEXED BY clause specifies a particular index to use */
    pProbe = pSrc->pIBIndex;
  }else if( !HasRowid(pTab) ){
    pProbe = pTab->pIndex;
  }else{
    /* There is no INDEXED BY clause.  Create a fake Index object in local
    ** variable sPk to represent the rowid primary key index.  Make this
    ** fake index the first in a chain of Index objects with all of the real
    ** indices to follow */
    Index *pFirst;                  /* First of real indices on the table */
    memset(&sPk, 0, sizeof(Index));
    sPk.nKeyCol = 1;
    sPk.nColumn = 1;
    sPk.aiColumn = &aiColumnPk;
    sPk.aiRowLogEst = aiRowEstPk;
    sPk.onError = OE_Replace;
    sPk.pTable = pTab;
    sPk.szIdxRow = pTab->szTabRow;
    aiRowEstPk[0] = pTab->nRowLogEst;
    aiRowEstPk[1] = 0;
    pFirst = pSrc->pTab->pIndex;
    if( pSrc->fg.notIndexed==0 ){
      /* The real indices of the table are only considered if the
      ** NOT INDEXED qualifier is omitted from the FROM clause */
      sPk.pNext = pFirst;
    }
    pProbe = &sPk;
  }
  rSize = pTab->nRowLogEst;
  rLogSize = estLog(rSize);

#ifndef SQLITE_OMIT_AUTOMATIC_INDEX
  /* Automatic indexes */
  if( !pBuilder->pOrSet      /* Not part of an OR optimization */
   && (pWInfo->wctrlFlags & WHERE_OR_SUBCLAUSE)==0
   && (pWInfo->pParse->db->flags & SQLITE_AutoIndex)!=0
   && pSrc->pIBIndex==0      /* Has no INDEXED BY clause */
   && !pSrc->fg.notIndexed   /* Has no NOT INDEXED clause */
   && HasRowid(pTab)         /* Not WITHOUT ROWID table. (FIXME: Why not?) */
   && !pSrc->fg.isCorrelated /* Not a correlated subquery */
   && !pSrc->fg.isRecursive  /* Not a recursive common table expression. */
  ){
    /* Generate auto-index WhereLoops */
    WhereTerm *pTerm;
    WhereTerm *pWCEnd = pWC->a + pWC->nTerm;
    for(pTerm=pWC->a; rc==SQLITE_OK && pTerm<pWCEnd; pTerm++){
      if( pTerm->prereqRight & pNew->maskSelf ) continue;
      if( termCanDriveIndex(pTerm, pSrc, 0) ){
        pNew->u.btree.nEq = 1;
        pNew->nSkip = 0;
        pNew->u.btree.pIndex = 0;
        pNew->nLTerm = 1;
        pNew->aLTerm[0] = pTerm;
        /* TUNING: One-time cost for computing the automatic index is
        ** estimated to be X*N*log2(N) where N is the number of rows in
        ** the table being indexed and where X is 7 (LogEst=28) for normal
        ** tables or 1.375 (LogEst=4) for views and subqueries.  The value
        ** of X is smaller for views and subqueries so that the query planner
        ** will be more aggressive about generating automatic indexes for
        ** those objects, since there is no opportunity to add schema
        ** indexes on subqueries and views. */
        pNew->rSetup = rLogSize + rSize + 4;
        if( pTab->pSelect==0 && (pTab->tabFlags & TF_Ephemeral)==0 ){
          pNew->rSetup += 24;
        }
        ApplyCostMultiplier(pNew->rSetup, pTab->costMult);
        if( pNew->rSetup<0 ) pNew->rSetup = 0;
        /* TUNING: Each index lookup yields 20 rows in the table.  This
        ** is more than the usual guess of 10 rows, since we have no way
        ** of knowing how selective the index will ultimately be.  It would
        ** not be unreasonable to make this value much larger. */
        pNew->nOut = 43;  assert( 43==sqlite3LogEst(20) );
        pNew->rRun = sqlite3LogEstAdd(rLogSize,pNew->nOut);
        pNew->wsFlags = WHERE_AUTO_INDEX;
        pNew->prereq = mPrereq | pTerm->prereqRight;
        rc = whereLoopInsert(pBuilder, pNew);
      }
    }
  }
#endif /* SQLITE_OMIT_AUTOMATIC_INDEX */

  /* Loop over all indices
  */
  for(; rc==SQLITE_OK && pProbe; pProbe=pProbe->pNext, iSortIdx++){
    if( pProbe->pPartIdxWhere!=0
     && !whereUsablePartialIndex(pSrc->iCursor, pWC, pProbe->pPartIdxWhere) ){
      testcase( pNew->iTab!=pSrc->iCursor );  /* See ticket [98d973b8f5] */
      continue;  /* Partial index inappropriate for this query */
    }
    rSize = pProbe->aiRowLogEst[0];
    pNew->u.btree.nEq = 0;
    pNew->u.btree.nBtm = 0;
    pNew->u.btree.nTop = 0;
    pNew->nSkip = 0;
    pNew->nLTerm = 0;
    pNew->iSortIdx = 0;
    pNew->rSetup = 0;
    pNew->prereq = mPrereq;
    pNew->nOut = rSize;
    pNew->u.btree.pIndex = pProbe;
    b = indexMightHelpWithOrderBy(pBuilder, pProbe, pSrc->iCursor);
    /* The ONEPASS_DESIRED flags never occurs together with ORDER BY */
    assert( (pWInfo->wctrlFlags & WHERE_ONEPASS_DESIRED)==0 || b==0 );
    if( pProbe->tnum<=0 ){
      /* Integer primary key index */
      pNew->wsFlags = WHERE_IPK;

      /* Full table scan */
      pNew->iSortIdx = b ? iSortIdx : 0;
      /* TUNING: Cost of full table scan is (N*3.0). */
      pNew->rRun = rSize + 16;
      ApplyCostMultiplier(pNew->rRun, pTab->costMult);
      whereLoopOutputAdjust(pWC, pNew, rSize);
      rc = whereLoopInsert(pBuilder, pNew);
      pNew->nOut = rSize;
      if( rc ) break;
    }else{
      Bitmask m;
      if( pProbe->isCovering ){
        pNew->wsFlags = WHERE_IDX_ONLY | WHERE_INDEXED;
        m = 0;
      }else{
        m = pSrc->colUsed & ~columnsInIndex(pProbe);
        pNew->wsFlags = (m==0) ? (WHERE_IDX_ONLY|WHERE_INDEXED) : WHERE_INDEXED;
      }

      /* Full scan via index */
      if( b
       || !HasRowid(pTab)
       || pProbe->pPartIdxWhere!=0
       || ( m==0
         && pProbe->bUnordered==0
         && (pProbe->szIdxRow<pTab->szTabRow)
         && (pWInfo->wctrlFlags & WHERE_ONEPASS_DESIRED)==0
         && sqlite3GlobalConfig.bUseCis
         && OptimizationEnabled(pWInfo->pParse->db, SQLITE_CoverIdxScan)
          )
      ){
        pNew->iSortIdx = b ? iSortIdx : 0;

        /* The cost of visiting the index rows is N*K, where K is
        ** between 1.1 and 3.0, depending on the relative sizes of the
        ** index and table rows. */
        pNew->rRun = rSize + 1 + (15*pProbe->szIdxRow)/pTab->szTabRow;
        if( m!=0 ){
          /* If this is a non-covering index scan, add in the cost of
          ** doing table lookups.  The cost will be 3x the number of
          ** lookups.  Take into account WHERE clause terms that can be
          ** satisfied using just the index, and that do not require a
          ** table lookup. */
          LogEst nLookup = rSize + 16;  /* Base cost:  N*3 */
          int ii;
          int iCur = pSrc->iCursor;
          WhereClause *pWC2 = &pWInfo->sWC;
          for(ii=0; ii<pWC2->nTerm; ii++){
            WhereTerm *pTerm = &pWC2->a[ii];
            if( !sqlite3ExprCoveredByIndex(pTerm->pExpr, iCur, pProbe) ){
              break;
            }
            /* pTerm can be evaluated using just the index.  So reduce
            ** the expected number of table lookups accordingly */
            if( pTerm->truthProb<=0 ){
              nLookup += pTerm->truthProb;
            }else{
              nLookup--;
              if( pTerm->eOperator & (WO_EQ|WO_IS) ) nLookup -= 19;
            }
          }
          
          pNew->rRun = sqlite3LogEstAdd(pNew->rRun, nLookup);
        }
        ApplyCostMultiplier(pNew->rRun, pTab->costMult);
        whereLoopOutputAdjust(pWC, pNew, rSize);
        rc = whereLoopInsert(pBuilder, pNew);
        pNew->nOut = rSize;
        if( rc ) break;
      }
    }

    pBuilder->bldFlags = 0;
    rc = whereLoopAddBtreeIndex(pBuilder, pSrc, pProbe, 0);
    if( pBuilder->bldFlags==SQLITE_BLDF_INDEXED ){
      /* If a non-unique index is used, or if a prefix of the key for
      ** unique index is used (making the index functionally non-unique)
      ** then the sqlite_stat1 data becomes important for scoring the
      ** plan */
      pTab->tabFlags |= TF_StatsUsed;
    }
#ifdef SQLITE_ENABLE_STAT3_OR_STAT4
    sqlite3Stat4ProbeFree(pBuilder->pRec);
    pBuilder->nRecValid = 0;
    pBuilder->pRec = 0;
#endif

    /* If there was an INDEXED BY clause, then only that one index is
    ** considered. */
    if( pSrc->pIBIndex ) break;
  }
  return rc;
}